

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,NullType *type)

{
  UnsupportedType *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  Typelib::Type::getName_abi_cxx11_();
  std::operator+(&local_38,"null types are not supported for export in IDL, found ",&bStack_58);
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&local_38);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(NullType const& type)
    { throw UnsupportedType(type, "null types are not supported for export in IDL, found " + type.getName()); }